

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void __thiscall
v_array<ACTION_SCORE::action_score>::resize(v_array<ACTION_SCORE::action_score> *this,size_t length)

{
  action_score *__ptr;
  action_score *paVar1;
  action_score *paVar2;
  ostream *poVar3;
  vw_exception *this_00;
  long lVar4;
  long lVar5;
  string sStack_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  __ptr = this->_begin;
  if ((long)this->end_array - (long)__ptr >> 3 != length) {
    paVar1 = this->_end;
    paVar2 = (action_score *)realloc(__ptr,length * 8);
    if (length * 8 != 0 && paVar2 == (action_score *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar3 = std::operator<<(&local_1a8,"realloc of ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," failed in resize().  out of memory?");
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/v_array.h"
                 ,0x45,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    lVar5 = (long)paVar1 - (long)__ptr;
    this->_begin = paVar2;
    if ((paVar2 != (action_score *)0x0) &&
       (lVar4 = length - (lVar5 >> 3), (ulong)(lVar5 >> 3) <= length && lVar4 != 0)) {
      memset((void *)((long)paVar2 + lVar5),0,lVar4 * 8);
    }
    this->_end = (action_score *)(lVar5 + (long)paVar2);
    this->end_array = paVar2 + length;
  }
  return;
}

Assistant:

void resize(size_t length)
  {
    if ((size_t)(end_array - _begin) != length)
    {
      size_t old_len = _end - _begin;
      T* temp = (T*)realloc(_begin, sizeof(T) * length);
      if ((temp == nullptr) && ((sizeof(T) * length) > 0))
      {
        THROW("realloc of " << length << " failed in resize().  out of memory?");
      }
      else
        _begin = temp;
      if (old_len < length && _begin + old_len != nullptr)
        memset(_begin + old_len, 0, (length - old_len) * sizeof(T));
      _end = _begin + old_len;
      end_array = _begin + length;
    }
  }